

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void __thiscall
ArenaVector<SQCompilation::Expr_*>::_realloc
          (ArenaVector<SQCompilation::Expr_*> *this,size_type_conflict newsize)

{
  Expr **__dest;
  ulong uVar1;
  
  uVar1 = 4;
  if (newsize != 0) {
    uVar1 = (ulong)newsize;
  }
  __dest = (Expr **)Arena::allocate(this->_arena,uVar1 * 8);
  memcpy(__dest,this->_vals,(ulong)this->_size << 3);
  this->_vals = __dest;
  this->_allocated = (size_type_conflict)uVar1;
  return;
}

Assistant:

void _realloc(size_type newsize)
    {
        newsize = (newsize > 0) ? newsize : 4;
        T *newPtr = (T *)_arena->allocate(newsize * sizeof(T));
        memcpy(newPtr, _vals, _size * sizeof(T));
        _vals = newPtr;
        _allocated = newsize;
    }